

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckType(ScalarReplacementPass *this,Instruction *typeInst)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint64_t length;
  Instruction *typeInst_local;
  ScalarReplacementPass *this_local;
  
  bVar1 = CheckTypeAnnotations(this,typeInst);
  if (bVar1) {
    OVar2 = opt::Instruction::opcode(typeInst);
    if (OVar2 == OpTypeArray) {
      uVar3 = opt::Instruction::GetSingleWordInOperand(typeInst,1);
      bVar1 = IsSpecConstant(this,uVar3);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        length = GetArrayLength(this,typeInst);
        bVar1 = IsLargerThanSizeLimit(this,length);
        if (bVar1) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
    else if ((OVar2 == OpTypeRuntimeArray) || (OVar2 != OpTypeStruct)) {
      this_local._7_1_ = false;
    }
    else {
      uVar3 = opt::Instruction::NumInOperands(typeInst);
      if (uVar3 != 0) {
        uVar3 = opt::Instruction::NumInOperands(typeInst);
        bVar1 = IsLargerThanSizeLimit(this,(ulong)uVar3);
        if (!bVar1) {
          return true;
        }
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ScalarReplacementPass::CheckType(const Instruction* typeInst) const {
  if (!CheckTypeAnnotations(typeInst)) {
    return false;
  }

  switch (typeInst->opcode()) {
    case spv::Op::OpTypeStruct:
      // Don't bother with empty structs or very large structs.
      if (typeInst->NumInOperands() == 0 ||
          IsLargerThanSizeLimit(typeInst->NumInOperands())) {
        return false;
      }
      return true;
    case spv::Op::OpTypeArray:
      if (IsSpecConstant(typeInst->GetSingleWordInOperand(1u))) {
        return false;
      }
      if (IsLargerThanSizeLimit(GetArrayLength(typeInst))) {
        return false;
      }
      return true;
      // TODO(alanbaker): Develop some heuristics for when this should be
      // re-enabled.
      //// Specifically including matrix and vector in an attempt to reduce the
      //// number of vector registers required.
      // case spv::Op::OpTypeMatrix:
      // case spv::Op::OpTypeVector:
      //  if (IsLargerThanSizeLimit(GetNumElements(typeInst))) return false;
      //  return true;

    case spv::Op::OpTypeRuntimeArray:
    default:
      return false;
  }
}